

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O1

void asn1_type_set0_string(ASN1_TYPE *a,ASN1_STRING *str)

{
  uint uVar1;
  uint uVar2;
  ASN1_BOOLEAN AVar3;
  uint uVar4;
  
  uVar1 = str->type;
  uVar2 = 10;
  if (uVar1 != 0x10a) {
    uVar2 = uVar1;
  }
  uVar4 = 2;
  if (uVar1 != 0x102) {
    uVar4 = uVar2;
  }
  if ((uVar4 < 7) && ((0x62U >> (uVar4 & 0x1f) & 1) != 0)) {
    __assert_fail("type != V_ASN1_NULL && type != V_ASN1_OBJECT && type != V_ASN1_BOOLEAN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_type.cc"
                  ,0x40,"void asn1_type_set0_string(ASN1_TYPE *, ASN1_STRING *)");
  }
  asn1_type_cleanup(a);
  a->type = uVar4;
  if (uVar4 == 1) {
    AVar3 = 0xff;
    if (str == (ASN1_STRING *)0x0) {
      AVar3 = 0;
    }
    (a->value).boolean = AVar3;
  }
  else if ((uVar4 == 6) || (uVar4 != 5)) {
    (a->value).asn1_string = str;
  }
  else {
    (a->value).ptr = (char *)0x0;
  }
  return;
}

Assistant:

void asn1_type_set0_string(ASN1_TYPE *a, ASN1_STRING *str) {
  // |ASN1_STRING| types are almost the same as |ASN1_TYPE| types, except that
  // the negative flag is not reflected into |ASN1_TYPE|.
  int type = str->type;
  if (type == V_ASN1_NEG_INTEGER) {
    type = V_ASN1_INTEGER;
  } else if (type == V_ASN1_NEG_ENUMERATED) {
    type = V_ASN1_ENUMERATED;
  }

  // These types are not |ASN1_STRING| types and use a different
  // representation when stored in |ASN1_TYPE|.
  assert(type != V_ASN1_NULL && type != V_ASN1_OBJECT &&
         type != V_ASN1_BOOLEAN);
  ASN1_TYPE_set(a, type, str);
}